

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

void __thiscall
chrono::ChArchiveOut::out<int,double>
          (ChArchiveOut *this,
          ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
          *bVal)

{
  bool bVar1;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *puVar2;
  char *mname;
  char *pcVar3;
  size_type sVar4;
  reference __p;
  ChNameValue<std::pair<int,_double>_> local_c8;
  pair<int,_double> local_b0;
  undefined1 local_a0 [8];
  ChNameValue<std::pair<int,_double>_> array_key;
  char buffer [20];
  _Node_iterator_base<std::pair<const_int,_double>,_false> local_68;
  iterator it;
  int i;
  undefined1 local_50 [8];
  ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  specVal;
  ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  *bVal_local;
  ChArchiveOut *this_local;
  
  specVal._ptr_to_val =
       (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
        *)bVal;
  puVar2 = ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
           ::value(bVal);
  mname = ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
          ::name(bVal);
  pcVar3 = ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
           ::flags(bVal);
  ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  ::ChValueSpecific((ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
                     *)local_50,puVar2,mname,*pcVar3);
  puVar2 = ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
           ::value(bVal);
  sVar4 = std::
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::size(puVar2);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,local_50,sVar4);
  it.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur._0_4_ = 0;
  puVar2 = ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
           ::value(bVal);
  local_68._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
       ::begin(puVar2);
  while( true ) {
    puVar2 = ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
             ::value(bVal);
    register0x00000000 =
         (__node_type *)
         std::
         unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
         ::end(puVar2);
    bVar1 = std::__detail::operator!=
                      (&local_68,
                       (_Node_iterator_base<std::pair<const_int,_double>,_false> *)(buffer + 0x10));
    if (!bVar1) break;
    sprintf(&array_key._flags,"%lu",
            (long)(int)it.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur);
    __p = std::__detail::_Node_iterator<std::pair<const_int,_double>,_false,_false>::operator*
                    ((_Node_iterator<std::pair<const_int,_double>,_false,_false> *)&local_68);
    std::pair<int,_double>::pair<const_int,_double,_true>(&local_b0,__p);
    ChNameValue<std::pair<int,_double>_>::ChNameValue
              ((ChNameValue<std::pair<int,_double>_> *)local_a0,&array_key._flags,&local_b0,'\0');
    ChNameValue<std::pair<int,_double>_>::ChNameValue
              (&local_c8,(ChNameValue<std::pair<int,_double>_> *)local_a0);
    out<int,double>(this,&local_c8);
    ChNameValue<std::pair<int,_double>_>::~ChNameValue(&local_c8);
    puVar2 = ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
             ::value(bVal);
    sVar4 = std::
            unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
            ::size(puVar2);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,local_50,sVar4);
    it.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur._0_4_ =
         (int)it.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur + 1;
    ChNameValue<std::pair<int,_double>_>::~ChNameValue
              ((ChNameValue<std::pair<int,_double>_> *)local_a0);
    std::__detail::_Node_iterator<std::pair<const_int,_double>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_int,_double>,_false,_false> *)&local_68);
  }
  puVar2 = ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
           ::value(bVal);
  sVar4 = std::
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          ::size(puVar2);
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,local_50,sVar4);
  ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  ::~ChValueSpecific((ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
                      *)local_50);
  return;
}

Assistant:

void out     (ChNameValue< std::unordered_map<T, Tv> > bVal) {
          ChValueSpecific< std::unordered_map<T, Tv> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre(specVal, bVal.value().size());
          int i=0;
          for ( auto it = bVal.value().begin(); it != bVal.value().end(); ++it )
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< std::pair<T, Tv> > array_key(buffer, (*it));
              this->out (array_key);
              this->out_array_between(specVal, bVal.value().size());
              ++i;
          }
          this->out_array_end(specVal, bVal.value().size());
      }